

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

int vkt::shaderexecutor::anon_unknown_0::getMaxNormalizedValueExponent(Precision precision)

{
  int exponent [3];
  Precision precision_local;
  
  exponent[1] = precision;
  exponent[0] = 0x7f;
  return exponent[(ulong)precision - 2];
}

Assistant:

static int getMaxNormalizedValueExponent (glu::Precision precision)
{
	const int exponent[] =
	{
		0,		// lowp
		13,		// mediump
		127		// highp
	};
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(exponent) == glu::PRECISION_LAST);
	DE_ASSERT(de::inBounds<int>(precision, 0, DE_LENGTH_OF_ARRAY(exponent)));
	return exponent[precision];
}